

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

bool __thiscall Indexing::ClauseCodeTree::LiteralMatcher::next(LiteralMatcher *this)

{
  bool bVar1;
  CodeOp *pCVar2;
  LiteralMatcher *in_RDI;
  Matcher *in_stack_00000018;
  LiteralMatcher *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  bVar1 = eagerlyMatched(in_RDI);
  if (bVar1) {
    bVar1 = Lib::Stack<Indexing::CodeTree::CodeOp_*>::isEmpty(&in_RDI->eagerResults);
    (in_RDI->super_Matcher)._matched = (bool)((bVar1 ^ 0xffU) & 1);
    if (((in_RDI->super_Matcher)._matched & 1U) == 0) {
      local_1 = false;
    }
    else {
      pCVar2 = Lib::Stack<Indexing::CodeTree::CodeOp_*>::pop(&in_RDI->eagerResults);
      (in_RDI->super_Matcher).super_BaseMatcher.op = pCVar2;
      local_1 = true;
    }
  }
  else {
    bVar1 = CodeTree::Matcher::finished(&in_RDI->super_Matcher);
    if (bVar1) {
      local_1 = false;
    }
    else {
      bVar1 = CodeTree::Matcher::execute(in_stack_00000018);
      (in_RDI->super_Matcher)._matched = bVar1;
      if (((in_RDI->super_Matcher)._matched & 1U) == 0) {
        local_1 = false;
      }
      else {
        bVar1 = CodeTree::CodeOp::isLitEnd((CodeOp *)0x2f64fe);
        if (bVar1) {
          recordMatch(this_00);
        }
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool ClauseCodeTree::LiteralMatcher::next()
{
  if(eagerlyMatched()) {
    _matched=!eagerResults.isEmpty();
    if(!_matched) {
      return false;
    }
    op=eagerResults.pop();
    return true;
  }

  if(finished()) {
    //all possible matches are exhausted
    return false;
  }

  _matched=execute();
  if(!_matched) {
    return false;
  }

  ASS(op->isLitEnd() || op->isSuccess());
  if(op->isLitEnd()) {
    recordMatch();
  }
  return true;
}